

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Hop_Man_t * Abc_NtkPartStartHop(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t *pHVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Hop_Obj_t *p1;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Hop_Man_t *pMan;
  Abc_Ntk_t *pNtk_local;
  
  p = Hop_ManStart();
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar2 = Vec_PtrAlloc(iVar1 + 1);
  p->vObjs = pVVar2;
  pVVar2 = p->vObjs;
  pHVar3 = Hop_ManConst1(p);
  Vec_PtrPush(pVVar2,pHVar3);
  pAVar4 = (Abc_Obj_t *)Hop_ManConst1(p);
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->pNext = pAVar4;
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_24);
    pAVar5 = (Abc_Obj_t *)Hop_ObjCreatePi(p);
    pAVar4->pNext = pAVar5;
  }
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_24) {
      for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_24);
        if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar4), iVar1 != 0)) &&
           ((pAVar4->field_6).pTemp != (void *)0x0)) {
          pAVar4->pNext->pNtk = (Abc_Ntk_t *)((pAVar4->field_6).pCopy)->pNext;
        }
      }
      for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
        pAVar4 = Abc_NtkCo(pNtk,local_24);
        pHVar3 = Hop_ObjChild0Next(pAVar4);
        Hop_ObjCreatePo(p,pHVar3);
      }
      iVar1 = Hop_ManCheck(p);
      if (iVar1 == 0) {
        printf("Abc_NtkPartStartHop: HOP manager check has failed.\n");
      }
      return p;
    }
    pAVar4 = Abc_NtkObj(pNtk,local_24);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar4), iVar1 != 0)) {
      pHVar3 = Hop_ObjChild0Next(pAVar4);
      p1 = Hop_ObjChild1Next(pAVar4);
      pAVar5 = (Abc_Obj_t *)Hop_And(p,pHVar3,p1);
      pAVar4->pNext = pAVar5;
      iVar1 = Abc_ObjIsComplement(pAVar4->pNext);
      if (iVar1 != 0) {
        __assert_fail("!Abc_ObjIsComplement(pObj->pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                      ,0x3cc,"Hop_Man_t *Abc_NtkPartStartHop(Abc_Ntk_t *)");
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Hop_Man_t * Abc_NtkPartStartHop( Abc_Ntk_t * pNtk )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj;
    int i;
    // start the HOP package
    pMan = Hop_ManStart();
    pMan->vObjs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) + 1  );
    Vec_PtrPush( pMan->vObjs, Hop_ManConst1(pMan) );
    // map constant node and PIs
    Abc_AigConst1(pNtk)->pNext = (Abc_Obj_t *)Hop_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)Hop_ObjCreatePi(pMan);
    // map the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        pObj->pNext = (Abc_Obj_t *)Hop_And( pMan, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Abc_ObjIsComplement(pObj->pNext) );
    }
    // set the choice nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( pObj->pCopy )
            ((Hop_Obj_t *)pObj->pNext)->pData = pObj->pCopy->pNext;
    }
    // transfer the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Hop_ObjCreatePo( pMan, Hop_ObjChild0Next(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pMan) )
        printf( "Abc_NtkPartStartHop: HOP manager check has failed.\n" );
    return pMan;
}